

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  ImVec4 *pIVar12;
  ImDrawCmd *pIVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ImDrawCmd *pIVar17;
  long lVar18;
  ImTextureID pvVar19;
  void *pvVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImVec4 curr_clip_rect;
  
  lVar14 = (long)(this->_ClipRectStack).Size;
  pIVar12 = (this->_ClipRectStack).Data + lVar14 + -1;
  if (lVar14 == 0) {
    pIVar12 = &this->_Data->ClipRectFullscreen;
  }
  uVar7 = pIVar12->x;
  uVar8 = pIVar12->y;
  uVar9 = pIVar12->z;
  uVar10 = pIVar12->w;
  uVar1 = (this->CmdBuffer).Size;
  lVar14 = (long)(int)uVar1;
  pIVar13 = (this->CmdBuffer).Data;
  if ((pIVar13 + lVar14 + -1 == (ImDrawCmd *)0x0 || lVar14 < 1) ||
     (((uVar2 = pIVar13[lVar14 + -1].ElemCount, curr_clip_rect.x._0_1_ = (char)uVar7,
       curr_clip_rect.x._1_1_ = (char)((uint)uVar7 >> 8),
       curr_clip_rect.x._2_1_ = (char)((uint)uVar7 >> 0x10),
       curr_clip_rect.x._3_1_ = (char)((uint)uVar7 >> 0x18), curr_clip_rect.y._0_1_ = (char)uVar8,
       curr_clip_rect.y._1_1_ = (char)((uint)uVar8 >> 8),
       curr_clip_rect.y._2_1_ = (char)((uint)uVar8 >> 0x10),
       curr_clip_rect.y._3_1_ = (char)((uint)uVar8 >> 0x18), curr_clip_rect.z._0_1_ = (char)uVar9,
       curr_clip_rect.z._1_1_ = (char)((uint)uVar9 >> 8),
       curr_clip_rect.z._2_1_ = (char)((uint)uVar9 >> 0x10),
       curr_clip_rect.z._3_1_ = (char)((uint)uVar9 >> 0x18), curr_clip_rect.w._0_1_ = (char)uVar10,
       curr_clip_rect.w._1_1_ = (char)((uint)uVar10 >> 8),
       curr_clip_rect.w._2_1_ = (char)((uint)uVar10 >> 0x10),
       curr_clip_rect.w._3_1_ = (char)((uint)uVar10 >> 0x18), uVar2 != 0 &&
       (auVar21[0] = -(*(char *)&pIVar13[lVar14 + -1].ClipRect.x == curr_clip_rect.x._0_1_),
       auVar21[1] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.x + 1) ==
                     curr_clip_rect.x._1_1_),
       auVar21[2] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.x + 2) ==
                     curr_clip_rect.x._2_1_),
       auVar21[3] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.x + 3) ==
                     curr_clip_rect.x._3_1_),
       auVar21[4] = -(*(char *)&pIVar13[lVar14 + -1].ClipRect.y == curr_clip_rect.y._0_1_),
       auVar21[5] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.y + 1) ==
                     curr_clip_rect.y._1_1_),
       auVar21[6] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.y + 2) ==
                     curr_clip_rect.y._2_1_),
       auVar21[7] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.y + 3) ==
                     curr_clip_rect.y._3_1_),
       auVar21[8] = -(*(char *)&pIVar13[lVar14 + -1].ClipRect.z == curr_clip_rect.z._0_1_),
       auVar21[9] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.z + 1) ==
                     curr_clip_rect.z._1_1_),
       auVar21[10] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.z + 2) ==
                      curr_clip_rect.z._2_1_),
       auVar21[0xb] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.z + 3) ==
                       curr_clip_rect.z._3_1_),
       auVar21[0xc] = -(*(char *)&pIVar13[lVar14 + -1].ClipRect.w == curr_clip_rect.w._0_1_),
       auVar21[0xd] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.w + 1) ==
                       curr_clip_rect.w._1_1_),
       auVar21[0xe] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.w + 2) ==
                       curr_clip_rect.w._2_1_),
       auVar21[0xf] = -(*(char *)((long)&pIVar13[lVar14 + -1].ClipRect.w + 3) ==
                       curr_clip_rect.w._3_1_),
       (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf)
       != 0xffff)) || (pIVar13[lVar14 + -1].UserCallback != (ImDrawCallback)0x0)))) {
    lVar14 = (long)(this->_ClipRectStack).Size;
    pIVar12 = (this->_ClipRectStack).Data + lVar14 + -1;
    if (lVar14 == 0) {
      pIVar12 = &this->_Data->ClipRectFullscreen;
    }
    fVar3 = pIVar12->x;
    fVar4 = pIVar12->y;
    fVar5 = pIVar12->z;
    fVar6 = pIVar12->w;
    lVar14 = (long)(this->_TextureIdStack).Size;
    if (lVar14 == 0) {
      pvVar20 = (void *)0x0;
    }
    else {
      pvVar20 = (this->_TextureIdStack).Data[lVar14 + -1];
    }
    if ((fVar3 <= fVar5) && (fVar4 <= fVar6)) {
      iVar11 = (this->CmdBuffer).Size;
      if (iVar11 == (this->CmdBuffer).Capacity) {
        if (iVar11 == 0) {
          iVar15 = 8;
        }
        else {
          iVar15 = iVar11 / 2 + iVar11;
        }
        iVar16 = iVar11 + 1;
        if (iVar11 + 1 < iVar15) {
          iVar16 = iVar15;
        }
        pIVar13 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar16 * 0x30);
        pIVar17 = (this->CmdBuffer).Data;
        if (pIVar17 == (ImDrawCmd *)0x0) {
          pIVar17 = (ImDrawCmd *)0x0;
        }
        else {
          memcpy(pIVar13,pIVar17,(long)(this->CmdBuffer).Size * 0x30);
          pIVar17 = (this->CmdBuffer).Data;
        }
        ImGui::MemFree(pIVar17);
        (this->CmdBuffer).Data = pIVar13;
        (this->CmdBuffer).Capacity = iVar16;
        iVar11 = (this->CmdBuffer).Size;
      }
      else {
        pIVar13 = (this->CmdBuffer).Data;
      }
      pIVar13[iVar11].ElemCount = 0;
      pIVar12 = &pIVar13[iVar11].ClipRect;
      pIVar12->x = fVar3;
      pIVar12->y = fVar4;
      pIVar12->z = fVar5;
      pIVar12->w = fVar6;
      pIVar13[iVar11].TextureId = pvVar20;
      pIVar13[iVar11].UserCallback = (ImDrawCallback)0x0;
      (&pIVar13[iVar11].UserCallback)[1] = (ImDrawCallback)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                  ,0x173,"void ImDrawList::AddDrawCmd()");
  }
  if (((1 < uVar1) && (uVar2 == 0)) &&
     (auVar22[0] = -(*(char *)&pIVar13[lVar14 + -2].ClipRect.x == curr_clip_rect.x._0_1_),
     auVar22[1] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.x + 1) == curr_clip_rect.x._1_1_)
     , auVar22[2] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.x + 2) ==
                     curr_clip_rect.x._2_1_),
     auVar22[3] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.x + 3) == curr_clip_rect.x._3_1_)
     , auVar22[4] = -(*(char *)&pIVar13[lVar14 + -2].ClipRect.y == curr_clip_rect.y._0_1_),
     auVar22[5] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.y + 1) == curr_clip_rect.y._1_1_)
     , auVar22[6] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.y + 2) ==
                     curr_clip_rect.y._2_1_),
     auVar22[7] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.y + 3) == curr_clip_rect.y._3_1_)
     , auVar22[8] = -(*(char *)&pIVar13[lVar14 + -2].ClipRect.z == curr_clip_rect.z._0_1_),
     auVar22[9] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.z + 1) == curr_clip_rect.z._1_1_)
     , auVar22[10] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.z + 2) ==
                      curr_clip_rect.z._2_1_),
     auVar22[0xb] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.z + 3) ==
                     curr_clip_rect.z._3_1_),
     auVar22[0xc] = -(*(char *)&pIVar13[lVar14 + -2].ClipRect.w == curr_clip_rect.w._0_1_),
     auVar22[0xd] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.w + 1) ==
                     curr_clip_rect.w._1_1_),
     auVar22[0xe] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.w + 2) ==
                     curr_clip_rect.w._2_1_),
     auVar22[0xf] = -(*(char *)((long)&pIVar13[lVar14 + -2].ClipRect.w + 3) ==
                     curr_clip_rect.w._3_1_),
     (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf)
     == 0xffff)) {
    lVar18 = (long)(this->_TextureIdStack).Size;
    if (lVar18 == 0) {
      pvVar19 = (ImTextureID)0x0;
    }
    else {
      pvVar19 = (this->_TextureIdStack).Data[lVar18 + -1];
    }
    if ((pIVar13[lVar14 + -2].TextureId == pvVar19) &&
       (pIVar13[lVar14 + -2].UserCallback == (ImDrawCallback)0x0)) {
      (this->CmdBuffer).Size = uVar1 - 1;
      return;
    }
  }
  fVar3 = pIVar12->y;
  fVar4 = pIVar12->z;
  fVar5 = pIVar12->w;
  pIVar13[lVar14 + -1].ClipRect.x = pIVar12->x;
  pIVar13[lVar14 + -1].ClipRect.y = fVar3;
  pIVar13[lVar14 + -1].ClipRect.z = fVar4;
  pIVar13[lVar14 + -1].ClipRect.w = fVar5;
  return;
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}